

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBitString.h
# Opt level: O0

bool __thiscall jbcoin::STBitString<160UL>::isEquivalent(STBitString<160UL> *this,STBase *t)

{
  bool local_39;
  long local_38;
  STBitString<160UL> *v;
  STBase *t_local;
  STBitString<160UL> *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(t,&STBase::typeinfo,&STBitString<160ul>::typeinfo,0);
  }
  local_39 = false;
  if (local_38 != 0) {
    local_39 = jbcoin::operator==(&this->value_,(base_uint<160UL,_void> *)(local_38 + 0x10));
  }
  return local_39;
}

Assistant:

bool
    isEquivalent (const STBase& t) const override
    {
        const STBitString* v = dynamic_cast<const STBitString*> (&t);
        return v && (value_ == v->value_);
    }